

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFromString(Parser *this,string *input,Message *output)

{
  bool bVar1;
  StringPiece input_00;
  ArrayInputStream input_stream;
  
  input_00.length_ = (stringpiece_ssize_type)this->error_collector_;
  input_00.ptr_ = (char *)input->_M_string_length;
  bVar1 = anon_unknown_19::CheckParseInputSize(input_00,(ErrorCollector *)output);
  if (bVar1) {
    io::ArrayInputStream::ArrayInputStream
              (&input_stream,(input->_M_dataplus)._M_p,(int)input->_M_string_length,-1);
    bVar1 = Parse(this,&input_stream.super_ZeroCopyInputStream,output);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TextFormat::Parser::ParseFromString(const std::string& input,
                                         Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::ArrayInputStream input_stream(input.data(), input.size());
  return Parse(&input_stream, output);
}